

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_invalid_opc.cpp
# Opt level: O2

string * __thiscall
spvtools::opt::ReplaceInvalidOpcodePass::BuildWarningMessage_abi_cxx11_
          (string *__return_storage_ptr__,ReplaceInvalidOpcodePass *this,Op opcode)

{
  spv_opcode_desc opcode_info;
  allocator<char> local_19;
  spv_opcode_desc local_18;
  
  AssemblyGrammar::lookupOpcode(&((this->super_Pass).context_)->grammar_,opcode,&local_18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"Removing ",&local_19);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string ReplaceInvalidOpcodePass::BuildWarningMessage(spv::Op opcode) {
  spv_opcode_desc opcode_info;
  context()->grammar().lookupOpcode(opcode, &opcode_info);
  std::string message = "Removing ";
  message += opcode_info->name;
  message += " instruction because of incompatible execution model.";
  return message;
}